

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O2

void __thiscall ON_Linetype::Dump(ON_Linetype *this,ON_TextLog *dump)

{
  uint uVar1;
  int iVar2;
  ON_LinetypeSegment *pOVar3;
  ON_wString *src;
  wchar_t *pwVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  ON_wString usn;
  ON_UnitSystem us;
  ON_wString local_50;
  ON_UnitSystem local_48;
  
  ON_ModelComponent::Dump(&this->super_ON_ModelComponent,dump);
  uVar1 = (this->m_private->m_segments).m_count;
  ON_TextLog::Print(dump,"Segment count = %d\n",(ulong)uVar1);
  PatternLength(this);
  ON_TextLog::Print(dump,"Pattern length = %g\n");
  ON_TextLog::Print(dump,"Pattern = (");
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (lVar7 = 0; (ulong)uVar1 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
    pOVar3 = (this->m_private->m_segments).m_a;
    if (lVar7 != 0) {
      ON_TextLog::Print(dump,",");
    }
    iVar2 = *(int *)((long)&pOVar3->m_seg_type + lVar7);
    pcVar5 = "space";
    if (iVar2 != 2) {
      pcVar5 = "invalid";
    }
    if (iVar2 == 1) {
      pcVar5 = "line";
    }
    ON_TextLog::Print(dump,pcVar5);
  }
  ON_TextLog::Print(dump,")\n");
  pcVar5 = "Cap = Round\n";
  if (this->m_cap_style == Square) {
    pcVar5 = "Cap = Square\n";
  }
  pcVar6 = "Cap = Flat\n";
  if (this->m_cap_style != Flat) {
    pcVar6 = pcVar5;
  }
  ON_TextLog::Print(dump,pcVar6);
  pcVar5 = "Join = Round\n";
  if (this->m_join_style == Miter) {
    pcVar5 = "Join = Miter\n";
  }
  pcVar6 = "Join = Bevel\n";
  if (this->m_join_style != Bevel) {
    pcVar6 = pcVar5;
  }
  ON_TextLog::Print(dump,pcVar6);
  ON_TextLog::Print(dump,"Width = %d\n",this->m_width);
  ON_UnitSystem::ON_UnitSystem(&local_48,this->m_width_units);
  src = ON_UnitSystem::UnitSystemName(&local_48);
  ON_wString::ON_wString(&local_50,src);
  pwVar4 = ON_wString::Array(&local_50);
  ON_TextLog::Print(dump,"Width Units = %ls\n",pwVar4);
  if (0 < (this->m_private->m_taper_points).m_count) {
    ON_TextLog::Print(dump,"Taper count = %d\n");
  }
  ON_wString::~ON_wString(&local_50);
  ON_wString::~ON_wString(&local_48.m_custom_unit_name);
  return;
}

Assistant:

void ON_Linetype::Dump( ON_TextLog& dump ) const
{
  ON_ModelComponent::Dump(dump);
  const int segmentCount = SegmentCount();
  dump.Print( "Segment count = %d\n", segmentCount);
  dump.Print( "Pattern length = %g\n", PatternLength());
  dump.Print( "Pattern = (" );
  for( int i = 0; i < segmentCount; i++)
  {
    const ON_LinetypeSegment& seg = m_private->m_segments[i];
    if ( i )
      dump.Print(",");
    switch( seg.m_seg_type)
    {
    case ON_LinetypeSegment::eSegType::stLine:
      dump.Print( "line");
      break;
    case ON_LinetypeSegment::eSegType::stSpace:
      dump.Print( "space");
      break;
    default:
      dump.Print( "invalid");
      break;
    }
  }
  dump.Print(")\n");

  switch (m_cap_style)
  {
  case ON::LineCapStyle::Flat:
    dump.Print("Cap = Flat\n");
    break;
  case ON::LineCapStyle::Square:
    dump.Print("Cap = Square\n");
    break;
  case ON::LineCapStyle::Round:
  default:
    dump.Print("Cap = Round\n");
    break;
  }

  switch (m_join_style)
  {
  case ON::LineJoinStyle::Bevel:
    dump.Print("Join = Bevel\n");
    break;
  case ON::LineJoinStyle::Miter:
    dump.Print("Join = Miter\n");
    break;
  case ON::LineJoinStyle::Round:
  default:
    dump.Print("Join = Round\n");
    break;
  }

  dump.Print("Width = %d\n", Width());
  ON_UnitSystem us(WidthUnits());
  ON_wString usn = us.UnitSystemName();
  const wchar_t* s = usn.Array();
  dump.Print("Width Units = %ls\n", s);
  
  const ON_SimpleArray<ON_2dPoint>* taper = TaperPoints();
  if (taper && taper->Count()>0)
  {
    dump.Print("Taper count = %d\n", taper->Count());
  }
}